

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O2

void __thiscall TimerHeap::downHeap(TimerHeap *this,size_t index)

{
  ulong uVar1;
  bool bVar2;
  pointer psVar3;
  ulong uVar4;
  ulong uVar5;
  ulong index2;
  
  while( true ) {
    uVar1 = index * 2 + 1;
    psVar3 = (this->timerHeap_).
             super__Vector_base<std::shared_ptr<Timer>,_std::allocator<std::shared_ptr<Timer>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar4 = (long)(this->timerHeap_).
                  super__Vector_base<std::shared_ptr<Timer>,_std::allocator<std::shared_ptr<Timer>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)psVar3 >> 4;
    if (uVar4 <= uVar1) {
      return;
    }
    uVar5 = index * 2 + 2;
    index2 = uVar1;
    if (uVar5 < uVar4) {
      bVar2 = Timer::timeType_::operator<
                        (&(psVar3[uVar5].super___shared_ptr<Timer,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->timeout_,
                         &(psVar3[uVar1].super___shared_ptr<Timer,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->timeout_);
      index2 = uVar5;
      if (!bVar2) {
        index2 = uVar1;
      }
      psVar3 = (this->timerHeap_).
               super__Vector_base<std::shared_ptr<Timer>,_std::allocator<std::shared_ptr<Timer>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
    }
    bVar2 = Timer::timeType_::operator<
                      (&(psVar3[index].super___shared_ptr<Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                        ->timeout_,
                       &(psVar3[index2].super___shared_ptr<Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                        )->timeout_);
    if (bVar2) break;
    swapHeap(this,index,index2);
    index = index2;
  }
  return;
}

Assistant:

void TimerHeap::downHeap(size_t index) {
    size_t child = index * 2 + 1;
    while (child < timerHeap_.size()) {
        if (child + 1 < timerHeap_.size() && timerHeap_[child + 1]->timeout_ < timerHeap_[child]->timeout_) 
            ++child;
        if (timerHeap_[index]->timeout_ < timerHeap_[child]->timeout_) 
            break;
        swapHeap(index, child);
        index = child;
        child = index * 2 + 1;
    }
}